

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

bool __thiscall iDynTree::SensorsList::isConsistent(SensorsList *this,Model *model)

{
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar1;
  const_iterator cVar2;
  int iVar3;
  Sensor **ppSVar4;
  bool bVar5;
  ConstIterator it;
  ConstIterator local_30;
  
  ConstIterator::ConstIterator(&local_30,&this->pimpl->allSensors);
  bVar5 = true;
  do {
    if ((((local_30.externalIterator._M_current <
           ((local_30.iteratingList)->
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start) ||
         (((local_30.iteratingList)->
          super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish <= local_30.externalIterator._M_current)) ||
        (local_30.internalIterator._M_current <
         ((local_30.externalIterator._M_current)->
         super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
         super__Vector_impl_data._M_start)) ||
       (((local_30.externalIterator._M_current)->
        super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
        super__Vector_impl_data._M_finish <= local_30.internalIterator._M_current)) {
      return bVar5;
    }
    iVar3 = (*(*local_30.internalIterator._M_current)->_vptr_Sensor[7])
                      (*local_30.internalIterator._M_current,model);
    ppSVar4 = local_30.internalIterator._M_current + 1;
    local_30.internalIterator._M_current = ppSVar4;
    cVar2._M_current = local_30.externalIterator._M_current;
    if (((local_30.externalIterator._M_current)->
        super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
        super__Vector_impl_data._M_finish <= ppSVar4) {
      do {
        cVar2._M_current = local_30.externalIterator._M_current + 1;
        local_30.internalIterator._M_current = ppSVar4;
        if (cVar2._M_current ==
            ((local_30.iteratingList)->
            super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) break;
        local_30.internalIterator._M_current =
             local_30.externalIterator._M_current[1].
             super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        pvVar1 = local_30.externalIterator._M_current + 1;
        local_30.externalIterator._M_current = cVar2._M_current;
      } while (local_30.internalIterator._M_current ==
               (pvVar1->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_30.externalIterator._M_current = cVar2._M_current;
    bVar5 = (bool)(bVar5 & (byte)iVar3);
  } while( true );
}

Assistant:

bool SensorsList::isConsistent(const Model& model) const
{
    bool isConsistent = true;
    for (SensorsList::ConstIterator it = this->allSensorsIterator();
         it.isValid(); ++it)
    {
        bool isCurrentSensorConsistent = (*it)->isConsistent(model);
        isConsistent = isConsistent && isCurrentSensorConsistent;
    }
    return isConsistent;
}